

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O0

void Clasp::destroyDB(ConstraintDB *db,Solver *s,bool detach)

{
  bool bVar1;
  reference ppCVar2;
  byte in_DL;
  long in_RSI;
  pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_> *in_RDI;
  ConstraintDB *in_stack_00000078;
  Solver *in_stack_00000080;
  
  if ((in_RSI == 0) || ((in_DL & 1) == 0)) {
    while (bVar1 = bk_lib::pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_>::
                   empty(in_RDI), ((bVar1 ^ 0xffU) & 1) != 0) {
      ppCVar2 = bk_lib::pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_>::back
                          (in_RDI);
      (*(*ppCVar2)->_vptr_Constraint[5])(*ppCVar2,in_RSI,(ulong)(in_DL & 1));
      bk_lib::pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_>::pop_back
                (in_RDI);
    }
  }
  else {
    Solver::destroyDB(in_stack_00000080,in_stack_00000078);
  }
  return;
}

Assistant:

void destroyDB(Solver::ConstraintDB& db, Solver* s, bool detach) {
	if (s && detach) {
		s->destroyDB(db);
		return;
	}
	while (!db.empty()) {
		db.back()->destroy(s, detach);
		db.pop_back();
	}
}